

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode-t16.inc.c
# Opt level: O0

void disas_t16_extract_disas_t16_Fmt_30(DisasContext_conflict1 *ctx,arg_ldst_block *a,uint16_t insn)

{
  uint32_t x;
  int iVar1;
  uint16_t insn_local;
  arg_ldst_block *a_local;
  DisasContext_conflict1 *ctx_local;
  
  a->i = 0;
  a->b = 1;
  a->u = 0;
  a->w = 1;
  a->rn = 0xd;
  x = extract32((uint)insn,0,9);
  iVar1 = t16_push_list(ctx,x);
  a->list = iVar1;
  return;
}

Assistant:

static void disas_t16_extract_disas_t16_Fmt_30(DisasContext *ctx, arg_ldst_block *a, uint16_t insn)
{
    a->i = 0;
    a->b = 1;
    a->u = 0;
    a->w = 1;
    a->rn = 13;
    a->list = t16_push_list(ctx, extract32(insn, 0, 9));
}